

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_datetime<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  failure<toml::error_info> *__return_storage_ptr___00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  local_date lVar3;
  undefined2 uVar6;
  element_type *peVar4;
  long lVar5;
  undefined2 uVar7;
  ulong uVar8;
  size_t sVar9;
  error_type *this;
  value_type *pvVar10;
  error_type *this_00;
  value_type *pvVar11;
  ulong uVar12;
  error_info *v;
  error_info *v_00;
  undefined8 uVar13;
  basic_value<toml::type_config> *v_01;
  region *this_01;
  size_t sVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar15;
  local_datetime val;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  location first;
  source_location src;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined1 local_5c8 [16];
  pointer local_5b8;
  string local_5a8;
  string local_588;
  undefined1 local_568 [16];
  _Alloc_hider local_558;
  size_type local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  size_t local_538;
  size_t sStack_530;
  size_t sStack_528;
  size_t sStack_520;
  size_t local_518;
  size_t sStack_510;
  size_t local_508;
  region local_500;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  undefined8 local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450 [4];
  location local_408;
  undefined1 local_3c0 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  size_t local_348;
  size_t sStack_340;
  size_t local_338;
  size_t sStack_330;
  size_t local_328;
  size_t sStack_320;
  size_t local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  source_location local_2f8;
  undefined1 local_278 [120];
  basic_value<toml::type_config> local_200;
  failure<toml::error_info> local_138;
  undefined1 local_e0 [176];
  
  location::location(&local_408,loc);
  parse_local_date_only<toml::type_config>
            ((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
              *)local_278,loc,ctx);
  if (local_278[0] == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                         *)local_278,(source_location)0x5691e0);
    err<toml::error_info&>((failure<toml::error_info> *)local_e0,(toml *)this,v);
    __return_storage_ptr__->is_ok_ = false;
    this_01 = (region *)local_e0;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
               (failure<toml::error_info> *)this_01);
  }
  else {
    peVar4 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar12 = loc->location_;
    lVar5 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar5;
    if (uVar8 <= uVar12) {
LAB_003db51f:
      region::region((region *)local_498,loc);
      source_location::source_location((source_location *)local_3c0,(region *)local_498);
      region::~region((region *)local_498);
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_588,
                 "toml::parse_local_datetime: expect date-time delimiter `T`, `t` or ` `(space).",""
                );
      local_2f8.file_name_._M_dataplus._M_p = (pointer)&local_2f8.file_name_.field_2;
      local_2f8.last_offset_._0_4_ = local_3c0._48_4_;
      local_2f8.last_offset_._4_4_ = local_3c0._52_4_;
      local_2f8.length_._0_4_ = local_3c0._56_4_;
      local_2f8.length_._4_4_ = local_3c0._60_4_;
      local_2f8.last_line_ = local_3c0._32_8_;
      local_2f8.last_column_ = local_3c0._40_8_;
      local_2f8.first_offset_ = local_3c0._24_8_;
      local_2f8.first_line_ = local_3c0._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._64_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3c0 + 0x50)) {
        local_2f8.file_name_.field_2._8_8_ = local_3c0._88_8_;
      }
      else {
        local_2f8.file_name_._M_dataplus._M_p = (pointer)local_3c0._64_8_;
      }
      local_2f8.file_name_._M_string_length = local_3c0._72_8_;
      local_3c0._72_8_ = (element_type *)0x0;
      local_3c0._80_8_ = local_3c0._80_8_ & 0xffffffffffffff00;
      local_2f8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c0._96_8_;
      local_2f8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_358._M_allocated_capacity;
      local_2f8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_358._8_8_;
      stack0xfffffffffffffca0 = (undefined1  [16])0x0;
      aStack_358._8_8_ = (pointer)0x0;
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      local_3c0._64_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3c0 + 0x50);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"here","");
      make_error_info<>((error_info *)local_498,&local_588,&local_2f8,&local_5a8);
      __return_storage_ptr___00 = (failure<toml::error_info> *)(local_e0 + 0x58);
      err<toml::error_info>(__return_storage_ptr___00,(error_info *)local_498);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                 __return_storage_ptr___00);
      failure<toml::error_info>::~failure(__return_storage_ptr___00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460 != local_450) {
        operator_delete((void *)local_460,local_450[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_498._1_7_,local_498[0]) != &local_488) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_498._1_7_,local_498[0]),
                        (ulong)(local_488._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_3c0);
      goto LAB_003db741;
    }
    if (*(char *)(lVar5 + uVar12) == 'T') {
      if (uVar12 + 1 < uVar8) {
        if (*(char *)(lVar5 + uVar12) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar9 = 1;
        }
        else {
          sVar9 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar9;
        uVar15 = 0;
        uVar8 = uVar12 + 1;
      }
      else if (uVar8 == uVar12) {
        uVar15 = 0;
      }
      else {
        sVar9 = loc->line_number_;
        sVar14 = loc->column_number_;
        uVar15 = 0;
        do {
          if (*(char *)(lVar5 + uVar12) == '\n') {
            sVar9 = sVar9 + 1;
            loc->line_number_ = sVar9;
            sVar14 = 1;
          }
          else {
            sVar14 = sVar14 + 1;
          }
          loc->column_number_ = sVar14;
          uVar12 = uVar12 + 1;
        } while (uVar8 != uVar12);
      }
    }
    else {
      if (uVar8 <= uVar12) goto LAB_003db51f;
      if (*(char *)(lVar5 + uVar12) == 't') {
        if (uVar12 + 1 < uVar8) {
          if (*(char *)(lVar5 + uVar12) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar9 = 1;
          }
          else {
            sVar9 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar9;
          uVar15 = 1;
          uVar8 = uVar12 + 1;
        }
        else {
          uVar15 = 1;
          if (uVar8 != uVar12) {
            sVar9 = loc->line_number_;
            sVar14 = loc->column_number_;
            do {
              if (*(char *)(lVar5 + uVar12) == '\n') {
                sVar9 = sVar9 + 1;
                loc->line_number_ = sVar9;
                sVar14 = 1;
              }
              else {
                sVar14 = sVar14 + 1;
              }
              loc->column_number_ = sVar14;
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
        }
      }
      else {
        if ((uVar8 <= uVar12) || (*(char *)(lVar5 + uVar12) != ' ')) goto LAB_003db51f;
        if (uVar12 + 1 < uVar8) {
          if (*(char *)(lVar5 + uVar12) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar9 = 1;
          }
          else {
            sVar9 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar9;
          uVar15 = 2;
          uVar8 = uVar12 + 1;
        }
        else {
          uVar15 = 2;
          if (uVar8 != uVar12) {
            sVar9 = loc->line_number_;
            sVar14 = loc->column_number_;
            do {
              if (*(char *)(lVar5 + uVar12) == '\n') {
                sVar9 = sVar9 + 1;
                loc->line_number_ = sVar9;
                sVar14 = 1;
              }
              else {
                sVar14 = sVar14 + 1;
              }
              loc->column_number_ = sVar14;
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
        }
      }
    }
    loc->location_ = uVar8;
    parse_local_time_only<toml::type_config>
              ((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                *)local_498,loc,ctx);
    if (local_498[0] == false) {
      this_00 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap_err((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                              *)local_498,(source_location)0x5691f8);
      err<toml::error_info&>(&local_138,(toml *)this_00,v_00);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
    }
    else {
      pvVar10 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_498,(source_location)0x569210);
      bVar2 = (pvVar10->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
              super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
      pvVar10 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_498,(source_location)0x569228);
      local_3c0._32_8_ =
           (pvVar10->
           super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
           ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
           super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
           subsecond_precision;
      local_568._0_8_ =
           local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_568._8_8_ =
           local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_408.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_408.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_408.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_558._M_p = (pointer)&local_548;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_558,local_408.source_name_._M_dataplus._M_p,
                 local_408.source_name_._M_dataplus._M_p + local_408.source_name_._M_string_length);
      sStack_530 = local_408.location_;
      sStack_528 = local_408.line_number_;
      sStack_520 = local_408.column_number_;
      local_518 = loc->location_;
      sStack_510 = loc->line_number_;
      local_538 = local_518 - local_408.location_;
      local_508 = loc->column_number_;
      pvVar11 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_278,(source_location)0x569240);
      lVar3 = (pvVar11->
              super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
      pvVar10 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_498,(source_location)0x569258);
      local_3c0._96_8_ = local_550;
      local_3c0._80_8_ = local_568._8_8_;
      local_3c0._72_8_ = local_568._0_8_;
      local_3c0._24_8_ = (ulong)bVar2 << 8 | uVar15;
      uVar13._0_1_ = (pvVar10->
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
      uVar13._1_1_ = (pvVar10->
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
      uVar13._2_1_ = (pvVar10->
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
      uVar13._3_1_ = (pvVar10->
                     super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                     ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3;
      uVar6 = (pvVar10->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
      uVar7 = (pvVar10->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
      uVar13._4_4_ = CONCAT22(uVar7,uVar6);
      uStack_5d4 = (undefined4)uVar13;
      local_3c0._20_2_ =
           (undefined2)
           *(undefined4 *)
            &(pvVar10->
             super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
             ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond;
      local_3c0._8_8_ = CONCAT44(uStack_5d4,lVar3);
      paVar1 = &local_500.source_name_.field_2;
      local_568._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_568._0_8_ = (element_type *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_p == &local_548) {
        local_500.source_name_.field_2._8_8_ = local_548._8_8_;
        local_500.source_name_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_500.source_name_._M_dataplus._M_p = local_558._M_p;
      }
      local_500.source_name_.field_2._M_allocated_capacity._1_7_ =
           local_548._M_allocated_capacity._1_7_;
      local_500.source_name_.field_2._M_local_buf[0] = local_548._M_local_buf[0];
      local_550 = 0;
      local_548._M_local_buf[0] = '\0';
      local_500.length_ = local_538;
      local_500.first_ = sStack_530;
      local_500.first_line_ = sStack_528;
      local_500.first_column_ = sStack_520;
      local_500.last_ = local_518;
      local_500.last_line_ = sStack_510;
      local_500.last_column_ = local_508;
      local_3c0._88_8_ = &aStack_358;
      local_3c0[0] = (toml)0x6;
      local_3c0._16_4_ = uVar13._4_4_;
      local_500.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_500.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.source_name_._M_dataplus._M_p == paVar1) {
        aStack_358._8_8_ = local_500.source_name_.field_2._8_8_;
        uVar13 = local_500.source_name_._M_dataplus._M_p;
      }
      else {
        local_3c0._88_8_ = local_500.source_name_._M_dataplus._M_p;
        uVar13 = local_500.source_name_.field_2._M_allocated_capacity;
      }
      aStack_358._M_allocated_capacity = local_500.source_name_.field_2._M_allocated_capacity;
      local_500.source_name_._M_string_length = 0;
      local_500.source_name_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_548._M_allocated_capacity._1_7_ << 8;
      local_348 = local_538;
      sStack_340 = sStack_530;
      local_338 = sStack_528;
      sStack_330 = sStack_520;
      local_328 = local_518;
      sStack_320 = sStack_510;
      local_318 = local_508;
      local_310.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_310.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_310.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5c8 = (undefined1  [16])0x0;
      local_5b8 = (pointer)0x0;
      local_558._M_p = (pointer)&local_548;
      local_500.source_name_._M_dataplus._M_p = (pointer)paVar1;
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_3c0,
                 (basic_value<toml::type_config> *)uVar13);
      __return_storage_ptr__->is_ok_ = true;
      v_01 = &local_200;
      basic_value<toml::type_config>::basic_value
                (&(__return_storage_ptr__->field_1).succ_.value,v_01);
      basic_value<toml::type_config>::cleanup(&local_200,(EVP_PKEY_CTX *)v_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200.comments_.comments);
      region::~region(&local_200.region_);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_3c0,(EVP_PKEY_CTX *)v_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_310);
      region::~region((region *)(local_3c0 + 0x48));
      region::~region(&local_500);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5c8);
      region::~region((region *)local_568);
    }
    this_01 = (region *)(local_498 + 8);
    if (local_498[0] == true) {
      region::~region(this_01);
      goto LAB_003db741;
    }
  }
  failure<toml::error_info>::~failure((failure<toml::error_info> *)this_01);
LAB_003db741:
  if (local_278[0] == true) {
    region::~region((region *)(local_278 + 8));
  }
  else {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_278 + 8));
  }
  location::~location(&local_408);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;

    local_datetime_format_info fmt;

    // ----------------------------------------------------------------------

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_local_datetime: "
            "expect date-time delimiter `T`, `t` or ` `(space).",
            std::move(src), "here"));
    }

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------

    region reg(first, loc);
    local_datetime val(std::get<0>(date_fmt_reg.unwrap()),
                       std::get<0>(time_fmt_reg.unwrap()));

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}